

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_utf8(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *s;
  bson_t *b;
  bson_iter_t iter;
  uint32_t len;
  undefined1 local_100 [108];
  int local_94 [35];
  
  local_94[0] = 0;
  uVar3 = bson_new();
  bVar1 = bson_append_utf8(uVar3,"foo",0xffffffff,"bar");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x41,"test_bson_iter_utf8","bson_append_utf8 (b, \"foo\", -1, \"bar\", -1)");
    abort();
  }
  bVar1 = bson_append_utf8(uVar3,"bar",0xffffffff,"baz");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x42,"test_bson_iter_utf8","bson_append_utf8 (b, \"bar\", -1, \"baz\", -1)");
    abort();
  }
  bVar1 = bson_iter_init(local_100,uVar3);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x43,"test_bson_iter_utf8","bson_iter_init (&iter, b)");
    abort();
  }
  bVar1 = bson_iter_next(local_100);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x44,"test_bson_iter_utf8","bson_iter_next (&iter)");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x45,"test_bson_iter_utf8","BSON_ITER_HOLDS_UTF8 (&iter)");
    abort();
  }
  pcVar4 = (char *)bson_iter_key(local_100);
  iVar2 = strcmp(pcVar4,"foo");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x46,"test_bson_iter_utf8","!strcmp (bson_iter_key (&iter), \"foo\")");
    abort();
  }
  pcVar4 = (char *)bson_iter_utf8(local_100,0);
  iVar2 = strcmp(pcVar4,"bar");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x47,"test_bson_iter_utf8","!strcmp (bson_iter_utf8 (&iter, NULL), \"bar\")");
    abort();
  }
  pcVar4 = (char *)bson_iter_dup_utf8(local_100,local_94);
  if (pcVar4 != "bar") {
    iVar2 = strcmp("bar",pcVar4);
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d) \"%s\" != \"%s\"\n",0x49,"bar",pcVar4);
      abort();
    }
  }
  if (local_94[0] != 3) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)len == 3\n",0x4a);
    abort();
  }
  bson_free(pcVar4);
  bVar1 = bson_iter_next(local_100);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x4c,"test_bson_iter_utf8","bson_iter_next (&iter)");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x4d,"test_bson_iter_utf8","BSON_ITER_HOLDS_UTF8 (&iter)");
    abort();
  }
  pcVar4 = (char *)bson_iter_key(local_100);
  iVar2 = strcmp(pcVar4,"bar");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x4e,"test_bson_iter_utf8","!strcmp (bson_iter_key (&iter), \"bar\")");
    abort();
  }
  pcVar4 = (char *)bson_iter_utf8(local_100,0);
  iVar2 = strcmp(pcVar4,"baz");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x4f,"test_bson_iter_utf8","!strcmp (bson_iter_utf8 (&iter, NULL), \"baz\")");
    abort();
  }
  bVar1 = bson_iter_next(local_100);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x50,"test_bson_iter_utf8","!bson_iter_next (&iter)");
    abort();
  }
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_bson_iter_utf8 (void)
{
   uint32_t len = 0;
   bson_iter_t iter;
   bson_t *b;
   char *s;

   b = bson_new ();
   BSON_ASSERT (bson_append_utf8 (b, "foo", -1, "bar", -1));
   BSON_ASSERT (bson_append_utf8 (b, "bar", -1, "baz", -1));
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_next (&iter));
   BSON_ASSERT (BSON_ITER_HOLDS_UTF8 (&iter));
   BSON_ASSERT (!strcmp (bson_iter_key (&iter), "foo"));
   BSON_ASSERT (!strcmp (bson_iter_utf8 (&iter, NULL), "bar"));
   s = bson_iter_dup_utf8 (&iter, &len);
   BSON_ASSERT_CMPSTR ("bar", s);
   BSON_ASSERT_CMPINT (len, ==, 3);
   bson_free (s);
   BSON_ASSERT (bson_iter_next (&iter));
   BSON_ASSERT (BSON_ITER_HOLDS_UTF8 (&iter));
   BSON_ASSERT (!strcmp (bson_iter_key (&iter), "bar"));
   BSON_ASSERT (!strcmp (bson_iter_utf8 (&iter, NULL), "baz"));
   BSON_ASSERT (!bson_iter_next (&iter));
   bson_destroy (b);
}